

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 10.hpp
# Opt level: O2

void __thiscall njoy::ENDFtk::section::Type<10>::Type(Type<10> *this,Type<10> *param_1)

{
  double dVar1;
  undefined4 uVar2;
  
  uVar2 = *(undefined4 *)&(param_1->super_Base).field_0x14;
  (this->super_Base).MT_ = (param_1->super_Base).MT_;
  *(undefined4 *)&(this->super_Base).field_0x14 = uVar2;
  uVar2 = *(undefined4 *)
           &(param_1->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.field_0x4;
  dVar1 = (param_1->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.atomicWeightRatio_;
  (this->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.ZA_ =
       (param_1->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.ZA_;
  *(undefined4 *)&(this->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.field_0x4 =
       uVar2;
  (this->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.atomicWeightRatio_ = dVar1;
  *(undefined4 *)&(this->super_Base).field_0x14 = *(undefined4 *)&(param_1->super_Base).field_0x14;
  std::
  vector<njoy::ENDFtk::section::Type<10>::ReactionProduct,_std::allocator<njoy::ENDFtk::section::Type<10>::ReactionProduct>_>
  ::vector(&this->products_,&param_1->products_);
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT Type< 10 > : protected Base {

  public:

    #include "ENDFtk/section/10/ReactionProduct.hpp"

  private:

    /* fields */
    int lis_;
    std::vector< ReactionProduct > products_;

  public:

    /* constructor */
    #include "ENDFtk/section/10/src/ctor.hpp"

    /* methods */

    /**
     *  @brief Return the excited level number of the target
     */
    int LIS() const { return this->lis_; }

    /**
     *  @brief Return the excited level number of the target
     */
    int excitedLevel() const { return this->LIS(); }

    /**
     *  @brief Return the number of excited states for the reaction product
     */
    int NS() const { return this->products_.size(); }

    /**
     *  @brief Return the number of excited states for the reaction product
     */
    int numberReactionProducts() const { return this->NS(); }

    /**
     *  @brief Return whether or not the excited state is present
     *
     *  @param[in] state    the excited state to retrieve
     */
    bool hasExcitedState( int state ) const {

      return std::find_if( this->products_.begin(), this->products_.end(),
                           [state] ( auto&& product )
                                   { return product.excitedLevel() == state; } )
             != this->products_.end();
    }

    /**
     *  @brief Return the reaction product for the requested excited state
     *
     *  @param[in] state    the excited state to retrieve
     */
    const ReactionProduct& reactionProduct( int state ) const {

      auto iter = std::find_if( this->products_.begin(), this->products_.end(),
                                [state] ( auto&& product )
                                        { return product.excitedLevel() == state; } );
      if ( this->products_.end() == iter ) {

        Log::error( "The requested excited state {} is not present in MF10",
                    state );
        throw std::exception();
      }
      else {

        return *iter;
      }
    }

    /**
     *  @brief Return the reaction product data
     */
    auto reactionProducts() const {

      return ranges::cpp20::views::all( this->products_ );
    }

    #include "ENDFtk/section/10/src/NC.hpp"
    #include "ENDFtk/section/10/src/print.hpp"

    using Base::MT;
    using Base::sectionNumber;
    using Base::ZA;
    using Base::targetIdentifier;
    using Base::atomicWeightRatio;
    using Base::AWR;
  }